

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_legacy.hpp
# Opt level: O0

SetUpTearDownTestSuiteFuncType
iutest::legacy::
SuiteApiResolver<string_assertion_test::iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t>_>::
GetTearDownCaseOrSuite(char *file,int line)

{
  bool bVar1;
  iu_stringstream *piVar2;
  ostream *poVar3;
  int line_00;
  SetUpTearDownTestSuiteFuncType local_210;
  bool local_1e9;
  string local_1e8;
  IUTestLog local_1b8;
  SetUpTearDownTestSuiteFuncType local_28;
  SetUpTearDownTestSuiteFuncType testsuite;
  SetUpTearDownTestSuiteFuncType testcase;
  detail *pdStack_10;
  int line_local;
  char *file_local;
  
  testcase._4_4_ = line;
  pdStack_10 = (detail *)file;
  testsuite = GetNotDefaultOrNull(Test::TearDownTestCase,Test::TearDownTestCase);
  local_28 = GetNotDefaultOrNull(Test::TearDownTestSuite,Test::TearDownTestSuite);
  detail::AlwaysZero();
  local_1e9 = testsuite == (SetUpTearDownTestSuiteFuncType)0x0 ||
              local_28 == (SetUpTearDownTestSuiteFuncType)0x0;
  bVar1 = detail::IsTrue(local_1e9);
  if (!bVar1) {
    line_00 = 0x56;
    detail::IUTestLog::IUTestLog
              (&local_1b8,LOG_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_legacy.hpp"
               ,0x56);
    piVar2 = detail::IUTestLog::GetStream_abi_cxx11_(&local_1b8);
    poVar3 = std::operator<<((ostream *)&piVar2->field_0x10,
                             "Condition testcase == NULL || testsuite == NULL failed. ");
    poVar3 = std::operator<<(poVar3,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at "
                            );
    detail::FormatCompilerIndependentFileLocation_abi_cxx11_
              (&local_1e8,pdStack_10,(char *)(ulong)testcase._4_4_,line_00);
    std::operator<<(poVar3,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    detail::IUTestLog::~IUTestLog(&local_1b8);
  }
  if (testsuite == (SetUpTearDownTestSuiteFuncType)0x0) {
    local_210 = local_28;
  }
  else {
    local_210 = testsuite;
  }
  return local_210;
}

Assistant:

static SetUpTearDownTestSuiteFuncType GetTearDownCaseOrSuite(const char* file, int line)
    {
        SetUpTearDownTestSuiteFuncType testcase = GetNotDefaultOrNull(&T::TearDownTestCase, &Tester::TearDownTestCase);
        SetUpTearDownTestSuiteFuncType testsuite = GetNotDefaultOrNull(&T::TearDownTestSuite, &Tester::TearDownTestSuite);

        IUTEST_CHECK_( testcase == NULL || testsuite == NULL )
            << "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at "
            << detail::FormatCompilerIndependentFileLocation(file, line);

        return testcase != NULL ? testcase : testsuite;
    }